

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O0

void slang::ast::SFormat::formatStrength(string *result,SVInt *value)

{
  logic_t lVar1;
  uint uVar2;
  SVInt *in_RSI;
  logic_t l;
  bitwidth_t i;
  SVInt *in_stack_00000028;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_14;
  
  for (local_14 = SVInt::getBitWidth(in_RSI); local_14 != 0; local_14 = local_14 - 1) {
    lVar1 = SVInt::operator[](in_stack_00000028,result._4_4_);
    uVar2 = (uint)lVar1.value;
    if (uVar2 == 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)CONCAT14(lVar1.value,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    }
    else if (uVar2 == 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)CONCAT14(lVar1.value,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    }
    else if (uVar2 == 0x40) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)CONCAT14(lVar1.value,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (ulong)CONCAT14(lVar1.value,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    }
    if (local_14 != 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void formatStrength(std::string& result, const SVInt& value) {
    for (bitwidth_t i = value.getBitWidth(); i > 0; i--) {
        // At compile time it's impossible to know strength values so
        // we will always put "Strong" here, or "Hi" if it's high impedance.
        logic_t l = value[int32_t(i) - 1];
        switch (l.value) {
            case 0:
                result += "St0";
                break;
            case 1:
                result += "St1";
                break;
            case logic_t::X_VALUE:
                result += "StX";
                break;
            case logic_t::Z_VALUE:
                result += "HiZ";
                break;
            default:
                SLANG_UNREACHABLE;
        }

        if (i != 1)
            result += " ";
    }
}